

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O0

void anurbs::Box<2l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *pcVar1;
  offset_in_Model_to_subr local_d0 [2];
  code *local_c0;
  undefined8 local_b8;
  offset_in_Model_to_subr local_a8 [2];
  arg local_98;
  arg local_88;
  arg local_78;
  arg local_68;
  constructor<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  local_55 [13];
  handle local_48;
  class_<anurbs::Box<2L>,_std::shared_ptr<anurbs::Box<2L>_>_> local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::Box<2L>,_std::shared_ptr<anurbs::Box<2L>_>_>::class_<>
            (&local_40,local_48,name_00);
  pybind11::init<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Matrix<double,1,2,1,1,2>>();
  local_78 = pybind11::literals::operator____a("a",1);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  local_98 = pybind11::literals::operator____a("b",1);
  local_88.name = local_98.name;
  local_88._8_1_ = local_98._8_1_;
  pcVar1 = (class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *)
           pybind11::class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Matrix<double,1,2,1,1,2>,pybind11::arg,pybind11::arg>
                     ((class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *)&local_40,local_55
                      ,&local_68,&local_88);
  local_c0 = Box<2L>::min;
  local_b8 = 0;
  local_a8[0] = pybind11::detail::overload_cast_impl<>::operator()
                          ((overload_cast_impl<> *)&pybind11::overload_cast<>,Box<2L>::min,0);
  pcVar1 = (class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *)
           pybind11::class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>>::
           def_property_readonly<Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>(anurbs::Box<2l>::*)()>
                     (pcVar1,"min",local_a8);
  local_d0[0] = pybind11::detail::overload_cast_impl<>::operator()
                          ((overload_cast_impl<> *)&pybind11::overload_cast<>,Box<2L>::max,0);
  pybind11::class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>>::
  def_property_readonly<Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>(anurbs::Box<2l>::*)()>
            (pcVar1,"max",local_d0);
  pybind11::class_<anurbs::Box<2L>,_std::shared_ptr<anurbs::Box<2L>_>_>::~class_(&local_40);
  Model::register_python_data_type<anurbs::Box<2l>>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<Vector, Vector>(), "a"_a, "b"_a)
            // read-only properties
            .def_property_readonly("min", py::overload_cast<>(&Type::min))
            .def_property_readonly("max", py::overload_cast<>(&Type::max))
        ;

        Model::register_python_data_type<Type>(m, model);
    }